

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmeticdecoder.cpp
# Opt level: O1

U8 __thiscall ArithmeticDecoder::readByte(ArithmeticDecoder *this)

{
  U32 UVar1;
  ulong uVar2;
  undefined4 *puVar3;
  uint uVar4;
  
  uVar4 = this->length >> 8;
  this->length = uVar4;
  uVar2 = (ulong)this->value / (ulong)uVar4;
  this->value = this->value % uVar4;
  do {
    UVar1 = this->value;
    uVar4 = (**this->instream->_vptr_ByteStreamIn)();
    this->value = uVar4 | UVar1 << 8;
    uVar4 = this->length << 8;
    this->length = uVar4;
  } while (uVar4 < 0x1000000);
  if ((uint)uVar2 < 0x100) {
    return (U8)uVar2;
  }
  puVar3 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar3 = 0x1267;
  __cxa_throw(puVar3,&int::typeinfo,0);
}

Assistant:

U8 ArithmeticDecoder::readByte()
{
  U32 sym = value / (length >>= 8);            // decode symbol, change length
  value -= length * sym;                                    // update interval

  if (length < AC__MinLength) renorm_dec_interval();        // renormalization

  if (sym >= (1u<<8))
  {
    throw 4711;
  }

  return (U8)sym;
}